

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.cpp
# Opt level: O1

essential_t *
opengv::relative_pose::eightpt
          (essential_t *__return_storage_ptr__,RelativeAdapterBase *adapter,Indices *indices)

{
  void *__dest;
  undefined1 (*__dest_00) [16];
  double dVar1;
  double dVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  size_t rows;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double *pdVar12;
  Index IVar13;
  undefined1 (*pauVar14) [16];
  int iVar15;
  long lVar16;
  ulong uVar17;
  undefined8 *puVar18;
  ActualDstType actualDst;
  int iVar19;
  size_t sVar20;
  ulong uVar21;
  ulong uVar22;
  long lVar23;
  ulong uVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  Index size;
  MatrixXd A;
  MatrixXd F_temp;
  Matrix<double,_9,_1,_0,_9,_1> f;
  Matrix3d Vtr;
  Matrix3d S;
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> SVD;
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> SVD2;
  DenseStorage<double,__1,__1,__1,_0> local_678;
  DenseStorage<double,__1,__1,__1,_0> local_658;
  long local_638;
  undefined1 (*local_630) [16];
  DenseStorage<double,__1,__1,__1,_0> local_628;
  undefined8 uStack_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined1 local_5f8 [16];
  double local_5e8;
  double *local_5e0;
  DenseStorage<double,__1,__1,__1,_0> *local_5d8;
  double *local_5d0;
  undefined8 local_5c8;
  double local_5b8 [4];
  double local_598;
  double dStack_590;
  double local_588;
  double adStack_580 [6];
  double local_550;
  double local_548;
  double local_540;
  double local_538;
  double local_530;
  undefined8 local_528;
  undefined8 uStack_520;
  double local_518 [2];
  undefined1 local_508 [32];
  double dStack_4e8;
  undefined8 local_4c8;
  undefined1 local_4b8 [64];
  undefined8 local_478;
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> local_470;
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> local_250;
  undefined1 auVar28 [64];
  
  rows = indices->_numberCorrespondences;
  local_678.m_data = (double *)0x0;
  local_678.m_rows = 0;
  local_678.m_cols = 0;
  if (0xe38e38e38e38e38 < (long)rows) {
    puVar18 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar18 = acos;
    __cxa_throw(puVar18,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_678,rows * 9,rows,9);
  if (rows != 0) {
    lVar23 = 0;
    sVar20 = 0;
    do {
      iVar19 = (int)sVar20;
      iVar15 = iVar19;
      if (indices->_useIndices != false) {
        iVar15 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                                _M_impl.super__Vector_impl_data._M_start + (lVar23 >> 0x1e));
      }
      (*adapter->_vptr_RelativeAdapterBase[3])(&local_470,adapter,(long)iVar15);
      if (indices->_useIndices != false) {
        iVar19 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                                _M_impl.super__Vector_impl_data._M_start + (lVar23 >> 0x1e));
      }
      (*adapter->_vptr_RelativeAdapterBase[2])(&local_250,adapter,(long)iVar19);
      local_678.m_data[sVar20] =
           (double)local_250.
                   super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                   m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_data *
           (double)local_470.
                   super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                   m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_data;
      local_678.m_data[sVar20 + local_678.m_rows] =
           (double)local_250.
                   super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                   m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_data *
           (double)local_470.
                   super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                   m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_rows;
      local_678.m_data[sVar20 + local_678.m_rows * 2] =
           (double)local_250.
                   super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                   m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_data *
           (double)local_470.
                   super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                   m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_cols;
      local_678.m_data[sVar20 + local_678.m_rows * 3] =
           (double)local_250.
                   super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                   m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_rows *
           (double)local_470.
                   super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                   m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_data;
      local_678.m_data[sVar20 + local_678.m_rows * 4] =
           (double)local_250.
                   super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                   m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_rows *
           (double)local_470.
                   super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                   m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_rows;
      local_678.m_data[sVar20 + local_678.m_rows * 5] =
           (double)local_250.
                   super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                   m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_rows *
           (double)local_470.
                   super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                   m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_cols;
      local_678.m_data[sVar20 + local_678.m_rows * 6] =
           (double)local_250.
                   super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                   m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_cols *
           (double)local_470.
                   super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                   m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_data;
      local_678.m_data[sVar20 + local_678.m_rows * 7] =
           (double)local_250.
                   super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                   m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_cols *
           (double)local_470.
                   super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                   m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_rows;
      local_678.m_data[sVar20 + local_678.m_rows * 8] =
           (double)local_250.
                   super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                   m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_cols *
           (double)local_470.
                   super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                   m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_cols;
      sVar20 = sVar20 + 1;
      lVar23 = lVar23 + 0x100000000;
    } while (rows != sVar20);
  }
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::JacobiSVD
            (&local_470,(MatrixType *)&local_678,0x14);
  local_5b8[0] = local_470.
                 super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                 m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data
                 [local_470.
                  super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                  m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_rows * 8];
  local_5b8[1] = (local_470.
                  super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                  m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_data +
                 local_470.
                 super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                 m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows * 8)[1];
  local_5b8[2] = local_470.
                 super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                 m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data
                 [local_470.
                  super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                  m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_rows * 8 + 2];
  local_5b8[3] = (local_470.
                  super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                  m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_data +
                 local_470.
                 super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                 m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows * 8 + 2)[1];
  local_598 = local_470.
              super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
              m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_data[local_470.
                     super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                     m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_rows * 8 + 4];
  dStack_590 = (local_470.
                super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                .m_data +
               local_470.
               super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
               m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
               m_rows * 8 + 4)[1];
  local_588 = local_470.
              super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
              m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_data[local_470.
                     super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                     m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_rows * 8 + 6];
  adStack_580[0] =
       (local_470.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
        m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
       + local_470.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
         m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
         * 8 + 6)[1];
  adStack_580[1] =
       local_470.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
       m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
       [local_470.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
        m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
        * 8 + 8];
  local_658.m_data = (double *)0x0;
  local_658.m_rows = 0;
  local_658.m_cols = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_658,9,3,3);
  IVar13 = local_658.m_rows;
  pdVar12 = local_658.m_data;
  uVar22 = local_658.m_rows;
  if ((((ulong)local_658.m_data & 7) == 0) &&
     (uVar22 = (ulong)(-((uint)((ulong)local_658.m_data >> 3) & 0x1fffffff) & 7),
     local_658.m_rows <= (long)uVar22)) {
    uVar22 = local_658.m_rows;
  }
  uVar21 = local_658.m_rows - uVar22;
  uVar24 = uVar21 + 7;
  if (-1 < (long)uVar21) {
    uVar24 = uVar21;
  }
  if (0 < (long)uVar22) {
    memcpy(local_658.m_data,local_5b8,uVar22 * 8);
  }
  lVar23 = (uVar24 & 0xfffffffffffffff8) + uVar22;
  if (7 < (long)uVar21) {
    lVar16 = uVar22 + 8;
    if ((long)(uVar22 + 8) < lVar23) {
      lVar16 = lVar23;
    }
    memcpy((undefined1 *)pdVar12 + uVar22 * 8,local_5b8 + uVar22,
           (~uVar22 + lVar16 & 0xfffffffffffffff8) * 8 + 0x40);
  }
  if (lVar23 < IVar13) {
    memcpy(*(undefined1 (*) [16])((long)pdVar12 + ((long)uVar24 >> 3) * 4 * 0x10) + uVar22 * 8,
           local_5b8 + uVar22 + ((long)uVar24 >> 3) * 8,(IVar13 - lVar23) * 8);
  }
  __dest = (undefined1 *)pdVar12 + IVar13 * 8;
  uVar22 = IVar13;
  if ((((ulong)__dest & 7) == 0) &&
     (uVar22 = (ulong)(-((uint)((ulong)__dest >> 3) & 0x1fffffff) & 7), IVar13 <= (long)uVar22)) {
    uVar22 = IVar13;
  }
  uVar21 = IVar13 - uVar22;
  uVar24 = uVar21 + 7;
  if (-1 < (long)uVar21) {
    uVar24 = uVar21;
  }
  if (0 < (long)uVar22) {
    memcpy(__dest,local_5b8 + 3,uVar22 * 8);
  }
  lVar23 = (uVar24 & 0xfffffffffffffff8) + uVar22;
  if (7 < (long)uVar21) {
    lVar16 = uVar22 + 8;
    if ((long)(uVar22 + 8) < lVar23) {
      lVar16 = lVar23;
    }
    memcpy((undefined1 *)pdVar12 + (uVar22 + IVar13) * 8,local_5b8 + uVar22 + 3,
           (~uVar22 + lVar16 & 0xfffffffffffffff8) * 8 + 0x40);
  }
  if (lVar23 < IVar13) {
    memcpy(*(undefined1 (*) [16])((long)pdVar12 + ((long)uVar24 >> 3) * 4 * 0x10) +
           IVar13 * 8 + uVar22 * 8,local_5b8 + uVar22 + ((long)uVar24 >> 3) * 8 + 3,
           (IVar13 - lVar23) * 8);
  }
  local_638 = IVar13 * 0x10;
  local_630 = (undefined1 (*) [16])pdVar12;
  __dest_00 = (undefined1 (*) [16])((long)pdVar12 + IVar13 * 0x10);
  uVar22 = IVar13;
  if ((((ulong)__dest_00 & 7) == 0) &&
     (uVar22 = (ulong)(-((uint)((ulong)__dest_00 >> 3) & 0x1fffffff) & 7), IVar13 <= (long)uVar22))
  {
    uVar22 = IVar13;
  }
  uVar21 = IVar13 - uVar22;
  uVar24 = uVar21 + 7;
  if (-1 < (long)uVar21) {
    uVar24 = uVar21;
  }
  if (0 < (long)uVar22) {
    memcpy(__dest_00,&local_588,uVar22 * 8);
  }
  lVar23 = (uVar24 & 0xfffffffffffffff8) + uVar22;
  if (7 < (long)uVar21) {
    lVar16 = uVar22 + 8;
    if ((long)(uVar22 + 8) < lVar23) {
      lVar16 = lVar23;
    }
    memcpy((void *)((long)*__dest_00 + uVar22 * 8),adStack_580 + (uVar22 - 1),
           (~uVar22 + lVar16 & 0xfffffffffffffff8) * 8 + 0x40);
  }
  pauVar14 = local_630;
  if (lVar23 < IVar13) {
    memcpy((void *)((long)__dest_00[((long)uVar24 >> 3) * 4] + uVar22 * 8),
           adStack_580 + ((long)uVar24 >> 3) * 8 + (uVar22 - 1),(IVar13 - lVar23) * 8);
  }
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)pauVar14[1];
  auVar27 = vbroadcastsd_avx512f(auVar4);
  auVar27 = vpermi2pd_avx512f(_DAT_00259600,ZEXT2464(CONCAT816(auVar27._16_8_,*pauVar14)),
                              ZEXT1664(*(undefined1 (*) [16])(*pauVar14 + IVar13 * 8)));
  auVar26._8_8_ = 0;
  auVar26._0_8_ = *(ulong *)(pauVar14[1] + IVar13 * 8);
  auVar28 = vbroadcastsd_avx512f(auVar26);
  auVar29._0_40_ = auVar27._0_40_;
  auVar29._40_8_ = auVar28._40_8_;
  auVar29._48_8_ = auVar27._48_8_;
  auVar29._56_8_ = auVar27._56_8_;
  local_4b8 = vpermi2pd_avx512f(_DAT_00259640,auVar29,
                                ZEXT1664(*(undefined1 (*) [16])(*pauVar14 + local_638)));
  local_478 = *(undefined8 *)(pauVar14[1] + local_638);
  local_628.m_data = (double *)0x0;
  local_628.m_rows = 0;
  local_628.m_cols = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_628,9,3,3);
  if ((local_628.m_rows != 3) || (local_628.m_cols != 3)) {
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_628,9,3,3);
  }
  pdVar12 = local_628.m_data;
  uVar24 = local_628.m_rows * local_628.m_cols;
  uVar22 = uVar24 + 7;
  if (-1 < (long)uVar24) {
    uVar22 = uVar24;
  }
  uVar21 = uVar22 & 0xfffffffffffffff8;
  if (7 < (long)uVar24) {
    uVar17 = 8;
    if (8 < (long)uVar21) {
      uVar17 = uVar21;
    }
    memcpy(local_628.m_data,local_4b8,uVar17 * 8);
  }
  if ((long)uVar21 < (long)uVar24) {
    lVar23 = (long)uVar22 >> 3;
    memcpy(pdVar12 + lVar23 * 8,local_4b8 + lVar23 * 0x40,uVar24 * 8 + lVar23 * -0x40);
  }
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::JacobiSVD
            (&local_250,(MatrixType *)&local_628,0x14);
  if (local_628.m_data != (double *)0x0) {
    free((void *)local_628.m_data[-1]);
  }
  local_4c8 = 0;
  stack0xfffffffffffffb00 = SUB6456(ZEXT864(0),0);
  local_508._0_8_ =
       *local_250.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
        m_singularValues.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
        m_data;
  _local_508 = ZEXT4064(CONCAT832(local_250.
                                  super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>
                                  .m_singularValues.
                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                  m_storage.m_data[1],local_508));
  auVar4 = *(undefined1 (*) [16])
            local_250.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
            m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_data;
  local_528 = *(undefined8 *)
               *(undefined1 (*) [16])
                ((long)local_250.
                       super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>
                       .m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                       m_storage.m_data + 0x10);
  uStack_520 = *(undefined8 *)
                (*(undefined1 (*) [16])
                  ((long)local_250.
                         super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>
                         .m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                         .m_storage.m_data + 0x10) + 8);
  local_518[0] = *(double *)
                  ((undefined1 *)
                   local_250.
                   super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                   m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_data +
                  local_250.
                  super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                  m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_rows * 8 + 8);
  local_518[1] = *(double *)
                  ((long)((undefined1 *)
                          local_250.
                          super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>
                          .m_matrixU.
                          super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                          .m_data +
                         local_250.
                         super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>
                         .m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                         .m_storage.m_rows * 8 + 8) + 8);
  auVar26 = *(undefined1 (*) [16])
             ((long)local_250.
                    super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                    m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_data +
             local_250.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>
             .m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_rows * 0x10);
  dVar1 = *(double *)
           *(undefined1 (*) [16])
            ((long)local_250.
                   super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                   m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_data +
            (local_250.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>
             .m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_rows + 1) * 0x10);
  adStack_580[2] =
       *local_250.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
        m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data;
  adStack_580[3] =
       local_250.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
       m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
       [local_250.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
        m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows]
  ;
  adStack_580[4] =
       local_250.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
       m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
       [local_250.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
        m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
        * 2];
  adStack_580[5] =
       local_250.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
       m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
       [1];
  local_550 = local_250.
              super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
              m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_data[local_250.
                     super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                     m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_rows + 1];
  local_548 = local_250.
              super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
              m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_data[local_250.
                     super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                     m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_rows * 2 + 1];
  local_540 = local_250.
              super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
              m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_data[2];
  local_538 = local_250.
              super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
              m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_data[local_250.
                     super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                     m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_rows + 2];
  local_530 = local_250.
              super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
              m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_data[local_250.
                     super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                     m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_rows * 2 + 2];
  auVar11._8_8_ = local_518[0];
  auVar11._0_8_ =
       *(undefined8 *)
        (*(undefined1 (*) [16])
          ((long)local_250.
                 super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                 m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data + 0x10) + 8);
  auVar5 = vmovhpd_avx(*(undefined1 (*) [16])
                        ((long)local_250.
                               super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>
                               .m_matrixU.
                               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                               m_storage.m_data + 0x10),local_518[1]);
  lVar23 = 0x10;
  do {
    dVar2 = *(double *)(local_508 + lVar23);
    auVar30._8_8_ = dVar2;
    auVar30._0_8_ = dVar2;
    auVar25._8_8_ = *(undefined8 *)((long)local_518 + lVar23);
    auVar25._0_8_ = *(undefined8 *)((long)local_518 + lVar23);
    auVar25 = vmulpd_avx512vl(auVar4,auVar25);
    auVar6._8_8_ = *(undefined8 *)(local_508 + lVar23 + -8);
    auVar6._0_8_ = *(undefined8 *)(local_508 + lVar23 + -8);
    auVar25 = vfmadd231pd_avx512vl(auVar25,auVar11,auVar6);
    auVar25 = vfmadd231pd_fma(auVar25,auVar26,auVar30);
    *(undefined1 (*) [16])((long)&local_638 + lVar23) = auVar25;
    auVar32._0_8_ = auVar5._0_8_ * *(double *)((long)local_518 + lVar23);
    auVar32._8_8_ = auVar5._8_8_ * *(double *)(local_508 + lVar23 + -8);
    auVar25 = vshufpd_avx(auVar32,auVar32,1);
    *(double *)((long)&local_628.m_data + lVar23) = auVar32._0_8_ + dVar1 * dVar2 + auVar25._0_8_;
    lVar23 = lVar23 + 0x18;
  } while (lVar23 != 0x58);
  local_5e0 = adStack_580 + 2;
  local_5c8 = 3;
  auVar5._8_8_ = local_628.m_rows;
  auVar5._0_8_ = local_628.m_data;
  auVar9._8_8_ = uStack_610;
  auVar9._0_8_ = local_628.m_cols;
  auVar10._8_8_ = uStack_608;
  auVar10._0_8_ = uStack_610;
  auVar4 = vmovhpd_avx(auVar9,local_600);
  lVar23 = 0x10;
  do {
    dVar1 = *(double *)((long)adStack_580 + lVar23 + 0x10);
    auVar31._8_8_ = dVar1;
    auVar31._0_8_ = dVar1;
    auVar7._8_8_ = *(undefined8 *)((long)adStack_580 + lVar23);
    auVar7._0_8_ = *(undefined8 *)((long)adStack_580 + lVar23);
    auVar26 = vmulpd_avx512vl(auVar5,auVar7);
    uVar3 = *(undefined8 *)((long)adStack_580 + lVar23 + 8);
    auVar8._8_8_ = uVar3;
    auVar8._0_8_ = uVar3;
    auVar26 = vfmadd231pd_avx512vl(auVar26,auVar10,auVar8);
    auVar26 = vfmadd231pd_fma(auVar26,local_5f8,auVar31);
    auVar33._0_8_ = auVar4._0_8_ * *(double *)((long)adStack_580 + lVar23);
    auVar33._8_8_ = auVar4._8_8_ * *(double *)((long)adStack_580 + lVar23 + 8);
    *(undefined1 (*) [16])
     ((long)(__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
            m_storage.m_data.array + lVar23 + -0x10) = auVar26;
    auVar26 = vshufpd_avx(auVar33,auVar33,1);
    *(double *)
     ((long)(__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
            m_storage.m_data.array + lVar23) = auVar33._0_8_ + auVar26._0_8_ + local_5e8 * dVar1;
    lVar23 = lVar23 + 0x18;
  } while (lVar23 != 0x58);
  local_5d8 = &local_628;
  local_5d0 = local_5e0;
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::~JacobiSVD(&local_250);
  if ((undefined1 (*) [16])local_658.m_data != (undefined1 (*) [16])0x0) {
    free(*(void **)(*(undefined1 (*) [16])((long)local_658.m_data + -0x10) + 8));
  }
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::~JacobiSVD(&local_470);
  if (local_678.m_data != (double *)0x0) {
    free((void *)local_678.m_data[-1]);
  }
  return __return_storage_ptr__;
}

Assistant:

opengv::rotation_t
opengv::relative_pose::twopt_rotationOnly(
    const RelativeAdapterBase & adapter,
    const std::vector<int> & indices )
{
  assert(indices.size() > 1);
  return twopt_rotationOnly( adapter, indices[0], indices[1] );
}